

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

int lanli_buffer_putf(lanli_buffer *buf,FILE *file)

{
  int iVar1;
  size_t sVar2;
  
  if ((buf != (lanli_buffer *)0x0) && (buf->unit != 0)) {
    while ((iVar1 = feof((FILE *)file), iVar1 == 0 && (iVar1 = ferror((FILE *)file), iVar1 == 0))) {
      lanli_buffer_grow(buf,buf->unit + buf->size);
      sVar2 = fread(buf->data + buf->size,1,buf->unit,(FILE *)file);
      buf->size = buf->size + sVar2;
    }
    iVar1 = ferror((FILE *)file);
    return iVar1;
  }
  __assert_fail("buf && buf->unit",
                "/workspace/llm4binary/github/license_c_cmakelists/hoedown[P]lanli/src/buffer.c",
                0x59,"int lanli_buffer_putf(lanli_buffer *, FILE *)");
}

Assistant:

int lanli_buffer_putf(lanli_buffer *buf, FILE* file) {
  assert(buf && buf->unit);

  while (!(feof(file) || ferror(file))) {
    lanli_buffer_grow(buf, buf->size + buf->unit);
    buf->size += fread(buf->data + buf->size, 1, buf->unit, file);
  }

  return ferror(file);
}